

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::PushPopInst::display(PushPopInst *this,ostream *o)

{
  bool bVar1;
  iterator iVar2;
  ostream *in_RSI;
  _Rb_tree_const_iterator<unsigned_int> *in_RDI;
  iterator i;
  ostream *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  ostream *poVar3;
  _Self local_28;
  _Self local_20;
  int iVar4;
  
  display_op((OpCode)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8);
  display_cond((ConditionCode)((ulong)in_stack_ffffffffffffffc0 >> 0x38),in_stack_ffffffffffffffb8);
  std::operator<<(in_RSI," {");
  iVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffffb8);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,&local_20);
    if (!bVar1) break;
    local_28._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe8,&local_28);
    poVar3 = in_RSI;
    if (bVar1) {
      std::operator<<(in_RSI,", ");
      poVar3 = in_RSI;
    }
    in_RSI = poVar3;
    std::_Rb_tree_const_iterator<unsigned_int>::operator*
              ((_Rb_tree_const_iterator<unsigned_int> *)0x2c65f3);
    iVar4 = (int)((ulong)poVar3 >> 0x20);
    display_reg_name(in_RSI,(Reg)((ulong)iVar2._M_node >> 0x20));
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(in_RDI,iVar4);
  }
  std::operator<<(in_RSI,"}");
  return;
}

Assistant:

void PushPopInst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " {";
  for (auto i = regs.begin(); i != regs.end(); i++) {
    if (i != regs.begin()) o << ", ";
    display_reg_name(o, *i);
  }
  o << "}";
}